

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O1

void ihevc_inter_pred_chroma_horz_ssse3
               (UWORD8 *pu1_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  int iVar9;
  UWORD8 *pUVar10;
  long lVar11;
  UWORD8 *pUVar12;
  int iVar13;
  undefined1 auVar14 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar15 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint7 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  auVar21 = _DAT_00171840;
  auVar17 = _DAT_00171830;
  auVar16 = _DAT_00171810;
  iVar9 = src_strd * 2;
  if ((wd & 1U) != 0) {
    __assert_fail("(wd % 2 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_ssse3_intr.c"
                  ,0xe35,
                  "void ihevc_inter_pred_chroma_horz_ssse3(UWORD8 *, UWORD8 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)pi1_coeff;
  auVar15 = pshuflw(in_XMM1,auVar14,0);
  auVar15._4_4_ = auVar15._0_4_;
  auVar15._8_4_ = auVar15._0_4_;
  auVar15._12_4_ = auVar15._0_4_;
  auVar14 = pshufb(auVar14,_DAT_00171800);
  if ((wd & 2U) == 0) {
    if (0 < ht) {
      pUVar10 = pu1_dst + dst_strd;
      pUVar12 = pu1_src + (long)src_strd + -2;
      iVar13 = 0;
      auVar16 = pmovsxbw(in_XMM4,0x2020202020202020);
      do {
        if (0 < wd) {
          lVar11 = 0;
          do {
            auVar19 = *(undefined1 (*) [16])(pUVar12 + lVar11);
            auVar24 = pshufb(*(undefined1 (*) [16])(pu1_src + lVar11 + -2),auVar17);
            auVar22 = pshufb(*(undefined1 (*) [16])(pu1_src + lVar11 + -2),auVar21);
            auVar24 = pmaddubsw(auVar24,auVar15);
            auVar22 = pmaddubsw(auVar22,auVar14);
            auVar23._0_2_ = auVar22._0_2_ + auVar24._0_2_;
            auVar23._2_2_ = auVar22._2_2_ + auVar24._2_2_;
            auVar23._4_2_ = auVar22._4_2_ + auVar24._4_2_;
            auVar23._6_2_ = auVar22._6_2_ + auVar24._6_2_;
            auVar23._8_2_ = auVar22._8_2_ + auVar24._8_2_;
            auVar23._10_2_ = auVar22._10_2_ + auVar24._10_2_;
            auVar23._12_2_ = auVar22._12_2_ + auVar24._12_2_;
            auVar23._14_2_ = auVar22._14_2_ + auVar24._14_2_;
            auVar22 = paddsw(auVar23,auVar16);
            auVar22 = psraw(auVar22,6);
            sVar1 = auVar22._0_2_;
            sVar2 = auVar22._2_2_;
            sVar3 = auVar22._4_2_;
            sVar4 = auVar22._6_2_;
            sVar5 = auVar22._8_2_;
            sVar6 = auVar22._10_2_;
            sVar7 = auVar22._12_2_;
            sVar8 = auVar22._14_2_;
            *(ulong *)(pu1_dst + lVar11) =
                 CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar22[0xe] - (0xff < sVar8),
                          CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar22[0xc] - (0xff < sVar7),
                                   CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar22[10] -
                                            (0xff < sVar6),
                                            CONCAT14((0 < sVar5) * (sVar5 < 0x100) * auVar22[8] -
                                                     (0xff < sVar5),
                                                     CONCAT13((0 < sVar4) * (sVar4 < 0x100) *
                                                              auVar22[6] - (0xff < sVar4),
                                                              CONCAT12((0 < sVar3) * (sVar3 < 0x100)
                                                                       * auVar22[4] - (0xff < sVar3)
                                                                       ,CONCAT11((0 < sVar2) *
                                                                                 (sVar2 < 0x100) *
                                                                                 auVar22[2] -
                                                                                 (0xff < sVar2),
                                                                                 (0 < sVar1) *
                                                                                 (sVar1 < 0x100) *
                                                                                 auVar22[0] -
                                                                                 (0xff < sVar1))))))
                                  ));
            auVar22 = pshufb(auVar19,auVar17);
            auVar19 = pshufb(auVar19,auVar21);
            auVar22 = pmaddubsw(auVar22,auVar15);
            auVar19 = pmaddubsw(auVar19,auVar14);
            auVar20._0_2_ = auVar19._0_2_ + auVar22._0_2_;
            auVar20._2_2_ = auVar19._2_2_ + auVar22._2_2_;
            auVar20._4_2_ = auVar19._4_2_ + auVar22._4_2_;
            auVar20._6_2_ = auVar19._6_2_ + auVar22._6_2_;
            auVar20._8_2_ = auVar19._8_2_ + auVar22._8_2_;
            auVar20._10_2_ = auVar19._10_2_ + auVar22._10_2_;
            auVar20._12_2_ = auVar19._12_2_ + auVar22._12_2_;
            auVar20._14_2_ = auVar19._14_2_ + auVar22._14_2_;
            auVar19 = paddsw(auVar20,auVar16);
            auVar19 = psraw(auVar19,6);
            sVar1 = auVar19._0_2_;
            sVar2 = auVar19._2_2_;
            sVar3 = auVar19._4_2_;
            sVar4 = auVar19._6_2_;
            sVar5 = auVar19._8_2_;
            sVar6 = auVar19._10_2_;
            sVar7 = auVar19._12_2_;
            sVar8 = auVar19._14_2_;
            *(ulong *)(pUVar10 + lVar11) =
                 CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar19[0xe] - (0xff < sVar8),
                          CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar19[0xc] - (0xff < sVar7),
                                   CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar19[10] -
                                            (0xff < sVar6),
                                            CONCAT14((0 < sVar5) * (sVar5 < 0x100) * auVar19[8] -
                                                     (0xff < sVar5),
                                                     CONCAT13((0 < sVar4) * (sVar4 < 0x100) *
                                                              auVar19[6] - (0xff < sVar4),
                                                              CONCAT12((0 < sVar3) * (sVar3 < 0x100)
                                                                       * auVar19[4] - (0xff < sVar3)
                                                                       ,CONCAT11((0 < sVar2) *
                                                                                 (sVar2 < 0x100) *
                                                                                 auVar19[2] -
                                                                                 (0xff < sVar2),
                                                                                 (0 < sVar1) *
                                                                                 (sVar1 < 0x100) *
                                                                                 auVar19[0] -
                                                                                 (0xff < sVar1))))))
                                  ));
            lVar11 = lVar11 + 8;
          } while ((int)lVar11 < wd * 2);
        }
        pu1_src = pu1_src + iVar9;
        pu1_dst = pu1_dst + dst_strd * 2;
        iVar13 = iVar13 + 2;
        pUVar10 = pUVar10 + dst_strd * 2;
        pUVar12 = pUVar12 + iVar9;
      } while (iVar13 < ht);
    }
  }
  else if (0 < ht) {
    pUVar10 = pu1_dst + dst_strd;
    pUVar12 = pu1_src + (long)src_strd + -2;
    iVar13 = 0;
    auVar17 = pmovsxbw(in_XMM4,0x2020202020202020);
    do {
      if (0 < wd) {
        lVar11 = 0;
        do {
          auVar21 = *(undefined1 (*) [16])(pu1_src + lVar11 + -2);
          auVar19 = *(undefined1 (*) [16])(pUVar12 + lVar11);
          auVar22._0_14_ = auVar21._0_14_;
          auVar22[0xe] = auVar21[7];
          auVar22[0xf] = auVar19[7];
          auVar24._14_2_ = auVar22._14_2_;
          auVar24._0_13_ = auVar21._0_13_;
          auVar24[0xd] = auVar19[6];
          auVar30._13_3_ = auVar24._13_3_;
          auVar30._0_12_ = auVar21._0_12_;
          auVar30[0xc] = auVar21[6];
          auVar29._12_4_ = auVar30._12_4_;
          auVar29._0_11_ = auVar21._0_11_;
          auVar29[0xb] = auVar19[5];
          auVar28._11_5_ = auVar29._11_5_;
          auVar28._0_10_ = auVar21._0_10_;
          auVar28[10] = auVar21[5];
          auVar27._10_6_ = auVar28._10_6_;
          auVar27._0_9_ = auVar21._0_9_;
          auVar27[9] = auVar19[4];
          auVar26._9_7_ = auVar27._9_7_;
          auVar26._0_8_ = auVar21._0_8_;
          auVar26[8] = auVar21[4];
          auVar25._8_8_ = auVar26._8_8_;
          auVar25[7] = auVar19[3];
          auVar25[6] = auVar21[3];
          auVar25[5] = auVar19[2];
          auVar25[4] = auVar21[2];
          auVar25[3] = auVar19[1];
          auVar25[2] = auVar21[1];
          auVar25[0] = auVar21[0];
          auVar25[1] = auVar19[0];
          auVar22 = pshufb(auVar25,auVar16);
          auVar22 = pmaddubsw(auVar22,auVar15);
          auVar19 = pshufb(auVar19,ZEXT816(0x907080607050604));
          auVar21 = pshufb(auVar21,ZEXT816(0x907080607050604));
          auVar21._8_8_ = auVar19._0_8_;
          auVar21 = pmaddubsw(auVar21,auVar14);
          auVar19._0_2_ = auVar21._0_2_ + auVar22._0_2_;
          auVar19._2_2_ = auVar21._2_2_ + auVar22._2_2_;
          auVar19._4_2_ = auVar21._4_2_ + auVar22._4_2_;
          auVar19._6_2_ = auVar21._6_2_ + auVar22._6_2_;
          auVar19._8_2_ = auVar21._8_2_ + auVar22._8_2_;
          auVar19._10_2_ = auVar21._10_2_ + auVar22._10_2_;
          auVar19._12_2_ = auVar21._12_2_ + auVar22._12_2_;
          auVar19._14_2_ = auVar21._14_2_ + auVar22._14_2_;
          auVar21 = paddsw(auVar19,auVar17);
          auVar21 = psraw(auVar21,6);
          sVar1 = auVar21._0_2_;
          sVar2 = auVar21._2_2_;
          sVar3 = auVar21._4_2_;
          sVar4 = auVar21._6_2_;
          sVar5 = auVar21._8_2_;
          sVar6 = auVar21._10_2_;
          sVar7 = auVar21._12_2_;
          uVar18 = CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar21[0xc] - (0xff < sVar7),
                            CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar21[10] - (0xff < sVar6),
                                     CONCAT14((0 < sVar5) * (sVar5 < 0x100) * auVar21[8] -
                                              (0xff < sVar5),
                                              CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar21[6] -
                                                       (0xff < sVar4),
                                                       CONCAT12((0 < sVar3) * (sVar3 < 0x100) *
                                                                auVar21[4] - (0xff < sVar3),
                                                                CONCAT11((0 < sVar2) *
                                                                         (sVar2 < 0x100) *
                                                                         auVar21[2] - (0xff < sVar2)
                                                                         ,(0 < sVar1) *
                                                                          (sVar1 < 0x100) *
                                                                          auVar21[0] -
                                                                          (0xff < sVar1)))))));
          sVar1 = auVar21._14_2_;
          *(ulong *)(pu1_dst + lVar11) =
               (ulong)uVar18 & 0xffffffff | *(ulong *)(pu1_dst + lVar11) & 0xffffffff00000000;
          *(ulong *)(pUVar10 + lVar11) =
               CONCAT17((0 < sVar1) * (sVar1 < 0x100) * auVar21[0xe] - (0xff < sVar1),uVar18) >>
               0x20 | *(ulong *)(pUVar10 + lVar11) & 0xffffffff00000000;
          lVar11 = lVar11 + 4;
        } while ((int)lVar11 < wd * 2);
      }
      pu1_src = pu1_src + iVar9;
      pu1_dst = pu1_dst + dst_strd * 2;
      iVar13 = iVar13 + 2;
      pUVar10 = pUVar10 + dst_strd * 2;
      pUVar12 = pUVar12 + iVar9;
    } while (iVar13 < ht);
  }
  return;
}

Assistant:

void ihevc_inter_pred_chroma_horz_ssse3(UWORD8 *pu1_src,
                                        UWORD8 *pu1_dst,
                                        WORD32 src_strd,
                                        WORD32 dst_strd,
                                        WORD8 *pi1_coeff,
                                        WORD32 ht,
                                        WORD32 wd)
{
    WORD32 row, col;

    __m128i coeff0_1_8x16b, coeff2_3_8x16b, control_mask_1_8x16b, control_mask_2_8x16b, offset_8x16b, mask_low_32b, mask_high_96b;
    __m128i src_temp1_16x8b, src_temp2_16x8b, src_temp3_16x8b, src_temp4_16x8b, src_temp5_16x8b, src_temp6_16x8b;
    __m128i src_temp11_16x8b, src_temp12_16x8b, src_temp13_16x8b, src_temp14_16x8b, src_temp15_16x8b, src_temp16_16x8b;
    __m128i res_temp1_8x16b, res_temp2_8x16b, res_temp3_8x16b, res_temp4_8x16b, res_temp5_8x16b, res_temp6_8x16b, res_temp7_8x16b;
    __m128i res_temp11_8x16b, res_temp12_8x16b, res_temp13_8x16b, res_temp14_8x16b, res_temp15_8x16b, res_temp16_8x16b, res_temp17_8x16b;

    PREFETCH((char const *)(pu1_src + (0 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (1 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (2 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (3 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (4 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (5 * src_strd)), _MM_HINT_T0)

    ASSERT(wd % 2 == 0); /* checking assumption*/

/* loading four 8-bit coefficients  */
    src_temp1_16x8b = _mm_loadl_epi64((__m128i *)pi1_coeff);

    offset_8x16b = _mm_set1_epi16(OFFSET_14_MINUS_BIT_DEPTH); /* for offset addition */
    mask_low_32b = _mm_cmpeq_epi16(offset_8x16b, offset_8x16b);
    mask_high_96b = _mm_srli_si128(mask_low_32b, 12);
    mask_low_32b = _mm_slli_si128(mask_low_32b, 4);

    control_mask_1_8x16b = _mm_set1_epi32(0x01000100); /* Control Mask register */
    control_mask_2_8x16b = _mm_set1_epi32(0x03020302); /* Control Mask register */

    coeff0_1_8x16b = _mm_shuffle_epi8(src_temp1_16x8b, control_mask_1_8x16b);  /* pi1_coeff[4] */
    coeff2_3_8x16b = _mm_shuffle_epi8(src_temp1_16x8b, control_mask_2_8x16b);  /* pi1_coeff[4] */

/*  outer for loop starts from here */
    if(wd % 2 == 0 && wd % 4 != 0)
    {

        for(row = 0; row < ht; row += 2)
        {
            int offset = 0;

            PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)


            for(col = 0; col < 2 * wd; col += 4)
            {


                /*load 16 pixel values from row 0*/
                src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*load 16 pixel values from row 1*/
                src_temp11_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + src_strd + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*Derive the source pixels for processing the 2nd pixel*/
                src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);

                src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b);

                /*Derive the source pixels for processing the 3rd pixel*/
                src_temp3_16x8b = _mm_srli_si128(src_temp1_16x8b, 4);

                /*Derive the source pixels for processing the 4th pixel*/
                src_temp4_16x8b = _mm_srli_si128(src_temp1_16x8b, 6);

                src_temp6_16x8b = _mm_unpacklo_epi8(src_temp3_16x8b, src_temp4_16x8b);

                /*Derive the source pixels for processing the 2nd pixel*/
                src_temp12_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);

                src_temp15_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b);

                /*Derive the source pixels for processing the 3rd pixel*/
                src_temp13_16x8b = _mm_srli_si128(src_temp11_16x8b, 4);
                /*Derive the source pixels for processing the 4th pixel*/
                src_temp14_16x8b = _mm_srli_si128(src_temp11_16x8b, 6);

                src_temp16_16x8b = _mm_unpacklo_epi8(src_temp13_16x8b, src_temp14_16x8b);

                res_temp1_8x16b = _mm_unpacklo_epi64(src_temp5_16x8b, src_temp15_16x8b);
                res_temp2_8x16b = _mm_unpacklo_epi64(src_temp6_16x8b, src_temp16_16x8b);
                res_temp11_8x16b = _mm_maddubs_epi16(res_temp1_8x16b, coeff0_1_8x16b);
                res_temp12_8x16b = _mm_maddubs_epi16(res_temp2_8x16b, coeff2_3_8x16b);

                /* i4_tmp += pi1_coeff[i] * pi2_src[col + (i-1) * 2] */
                res_temp13_8x16b = _mm_add_epi16(res_temp11_8x16b, res_temp12_8x16b);

                res_temp14_8x16b = _mm_adds_epi16(res_temp13_8x16b, offset_8x16b);             /* row = 0 */
                res_temp15_8x16b = _mm_srai_epi16(res_temp14_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                res_temp13_8x16b = _mm_packus_epi16(res_temp15_8x16b, res_temp15_8x16b);       /* row = 0 */

                res_temp3_8x16b = _mm_srli_si128(res_temp13_8x16b, 4);

                res_temp4_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + offset));
                res_temp5_8x16b =  _mm_and_si128(res_temp4_8x16b, mask_low_32b);
                res_temp6_8x16b =  _mm_and_si128(res_temp13_8x16b, mask_high_96b);
                res_temp7_8x16b = _mm_or_si128(res_temp5_8x16b, res_temp6_8x16b);

                /* store 4 16-bit values */
                _mm_storel_epi64((__m128i *)(pu1_dst + offset), res_temp7_8x16b); /* pu1_dst[col] = i2_tmp_u  */

                res_temp14_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + dst_strd + offset));
                res_temp15_8x16b =  _mm_and_si128(res_temp14_8x16b, mask_low_32b);
                res_temp16_8x16b =  _mm_and_si128(res_temp3_8x16b, mask_high_96b);
                res_temp17_8x16b = _mm_or_si128(res_temp15_8x16b, res_temp16_8x16b);

                /* store 4 16-bit values */
                _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd + offset), res_temp17_8x16b); /* pu1_dst[col] = i2_tmp_u  */


                offset += 4; /* To pointer update*/

            } /* inner loop ends here(8- output values in single iteration)*/

            pu1_src += 2 * src_strd; /*pointer update*/
            pu1_dst += 2 * dst_strd; /*pointer update*/
        }
    }
    else
    {

        for(row = 0; row < ht; row += 2)
        {
            int offset = 0;

            PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)


            for(col = 0; col < 2 * wd; col += 8)
            {

                /*load 16 pixel values from row 0*/
                src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*load 16 pixel values from row 1*/
                src_temp11_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + src_strd + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*Derive the source pixels for processing the 2nd pixel*/
                src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);

                src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b);

                /*Derive the source pixels for processing the 3rd pixel*/
                src_temp3_16x8b = _mm_srli_si128(src_temp1_16x8b, 4);

                /*Derive the source pixels for processing the 4th pixel*/
                src_temp4_16x8b = _mm_srli_si128(src_temp1_16x8b, 6);

                src_temp6_16x8b = _mm_unpacklo_epi8(src_temp3_16x8b, src_temp4_16x8b);

                res_temp1_8x16b = _mm_maddubs_epi16(src_temp5_16x8b, coeff0_1_8x16b);
                res_temp2_8x16b = _mm_maddubs_epi16(src_temp6_16x8b, coeff2_3_8x16b);

                /* i4_tmp += pi1_coeff[i] * pi2_src[col + (i-1) * 2] */
                res_temp3_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);

                res_temp4_8x16b = _mm_adds_epi16(res_temp3_8x16b, offset_8x16b);             /* row = 0 */
                res_temp5_8x16b = _mm_srai_epi16(res_temp4_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                res_temp6_8x16b = _mm_packus_epi16(res_temp5_8x16b, res_temp5_8x16b);        /* row = 0 */

                /* store 4 16-bit values */
                _mm_storel_epi64((__m128i *)(pu1_dst + offset), res_temp6_8x16b); /* pi2_dst[col] = i2_tmp_u  */

                /*Derive the source pixels for processing the 2nd pixel of row 1*/
                src_temp12_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);

                src_temp15_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b);

                /*Derive the source pixels for processing the 3rd pixel of row 1*/
                src_temp13_16x8b = _mm_srli_si128(src_temp11_16x8b, 4);

                /*Derive the source pixels for processing the 4th pixel of row 1*/
                src_temp14_16x8b = _mm_srli_si128(src_temp11_16x8b, 6);

                src_temp16_16x8b = _mm_unpacklo_epi8(src_temp13_16x8b, src_temp14_16x8b);

                res_temp11_8x16b = _mm_maddubs_epi16(src_temp15_16x8b, coeff0_1_8x16b);
                res_temp12_8x16b = _mm_maddubs_epi16(src_temp16_16x8b, coeff2_3_8x16b);

                /* i4_tmp += pi1_coeff[i] * pi2_src[col + (i-1) * 2] */
                res_temp13_8x16b = _mm_add_epi16(res_temp11_8x16b, res_temp12_8x16b);

                res_temp14_8x16b = _mm_adds_epi16(res_temp13_8x16b, offset_8x16b);             /* row = 0 */
                res_temp15_8x16b = _mm_srai_epi16(res_temp14_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                res_temp16_8x16b = _mm_packus_epi16(res_temp15_8x16b, res_temp15_8x16b);       /* row = 0 */

                /* store 4 16-bit values */
                _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd + offset), res_temp16_8x16b); /* pu1_dst[col] = i2_tmp_u  */


                offset += 8; /* To pointer update*/

            } /* inner loop ends here(8- output values in single iteration)*/

            pu1_src += 2 * src_strd; /*pointer update*/
            pu1_dst += 2 * dst_strd; /*pointer update*/
        }
    }
}